

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::Doctype(cmXMLWriter *this,char *doctype)

{
  bool bVar1;
  size_type indent;
  ostream *poVar2;
  char *doctype_local;
  cmXMLWriter *this_local;
  
  CloseStartElement(this);
  bVar1 = this->IsContent;
  indent = std::
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::size(&this->Elements);
  ConditionalLineBreak(this,(bool)((bVar1 ^ 0xffU) & 1),indent);
  poVar2 = std::operator<<(this->Output,"<!DOCTYPE ");
  poVar2 = std::operator<<(poVar2,doctype);
  std::operator<<(poVar2,">");
  return;
}

Assistant:

void cmXMLWriter::Doctype(const char* doctype)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent, this->Elements.size());
  this->Output << "<!DOCTYPE " << doctype << ">";
}